

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O0

void read_frequency(frequency_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  time_exactness_t tVar2;
  long lVar3;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  frequency_t *record_local;
  
  init_frequency(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"trip_id");
    if (iVar1 == 0) {
      strcpy(record->trip_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"start_time");
      if (iVar1 == 0) {
        strcpy(record->start_time,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"end_time");
        if (iVar1 == 0) {
          strcpy(record->end_time,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"headway_secs");
          if (iVar1 == 0) {
            lVar3 = strtol(field_values[local_2c],(char **)0x0,0);
            record->headway_secs = (int)lVar3;
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"exact_times");
            if (iVar1 == 0) {
              tVar2 = parse_time_exactness(field_values[local_2c]);
              record->exact_times = tVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_frequency(frequency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_frequency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_time") == 0) {
            strcpy(record->start_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_time") == 0) {
            strcpy(record->end_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "headway_secs") == 0) {
            record->headway_secs = (int)strtol(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "exact_times") == 0) {
            record->exact_times = parse_time_exactness(field_values[i]);
            continue;
        }
    }
}